

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
zeGetFabricVertexExpProcAddrTable
          (ze_api_version_t version,ze_fabric_vertex_exp_dditable_t *pDdiTable)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar4;
  reference pvVar5;
  code *pcVar6;
  ze_device_handle_t local_78;
  ze_fabric_vertex_exp_dditable_t dditable;
  ze_pfnGetFabricVertexExpProcAddrTable_t getTable_2;
  ze_pfnGetFabricVertexExpProcAddrTable_t getTable_1;
  ze_pfnGetFabricVertexExpProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t result;
  ze_fabric_vertex_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar3 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_fabric_vertex_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    __range1._4_4_ = ZE_RESULT_SUCCESS;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar2) {
      pdVar4 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar4->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar6 = (code *)dlsym(pdVar4->handle,"zeGetFabricVertexExpProcAddrTable"),
         pcVar6 != (code *)0x0)) {
        __range1._4_4_ = (*pcVar6)(version,&(pdVar4->dditable).ze.FabricVertexExp);
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar3 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar5 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnGetExp = (pvVar5->dditable).ze.FabricVertexExp.pfnGetExp;
        pDdiTable->pfnGetSubVerticesExp = (pvVar5->dditable).ze.FabricVertexExp.pfnGetSubVerticesExp
        ;
        pDdiTable->pfnGetPropertiesExp = (pvVar5->dditable).ze.FabricVertexExp.pfnGetPropertiesExp;
        pDdiTable->pfnGetDeviceExp = (pvVar5->dditable).ze.FabricVertexExp.pfnGetDeviceExp;
      }
      else {
        pDdiTable->pfnGetExp = loader::zeFabricVertexGetExp;
        pDdiTable->pfnGetSubVerticesExp = loader::zeFabricVertexGetSubVerticesExp;
        pDdiTable->pfnGetPropertiesExp = loader::zeFabricVertexGetPropertiesExp;
        pDdiTable->pfnGetDeviceExp = loader::zeFabricVertexGetDeviceExp;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar6 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                             "zeGetFabricVertexExpProcAddrTable");
      if (pcVar6 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar6)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      dditable.pfnGetDeviceExp =
           (ze_pfnFabricVertexGetDeviceExp_t)
           dlsym(*(undefined8 *)(loader::context + 0x1620),"zeGetFabricVertexExpProcAddrTable");
      if (dditable.pfnGetDeviceExp == (ze_pfnFabricVertexGetDeviceExp_t)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      local_78 = (ze_device_handle_t)pDdiTable->pfnGetExp;
      dditable.pfnGetExp = (ze_pfnFabricVertexGetExp_t)pDdiTable->pfnGetSubVerticesExp;
      dditable.pfnGetSubVerticesExp =
           (ze_pfnFabricVertexGetSubVerticesExp_t)pDdiTable->pfnGetPropertiesExp;
      dditable.pfnGetPropertiesExp =
           (ze_pfnFabricVertexGetPropertiesExp_t)pDdiTable->pfnGetDeviceExp;
      __range1._4_4_ = (*dditable.pfnGetDeviceExp)((ze_fabric_vertex_handle_t)version,&local_78);
      lVar1 = loader::context;
      *(ze_device_handle_t *)(loader::context + 0x1c80) = local_78;
      *(ze_pfnFabricVertexGetExp_t *)(lVar1 + 0x1c88) = dditable.pfnGetExp;
      *(ze_pfnFabricVertexGetSubVerticesExp_t *)(lVar1 + 0x1c90) = dditable.pfnGetSubVerticesExp;
      *(ze_pfnFabricVertexGetPropertiesExp_t *)(lVar1 + 0x1c98) = dditable.pfnGetPropertiesExp;
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ =
             (*dditable.pfnGetDeviceExp)
                       ((ze_fabric_vertex_handle_t)version,(ze_device_handle_t *)pDdiTable);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFabricVertexExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fabric_vertex_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.FabricVertexExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetExp                                   = loader::zeFabricVertexGetExp;
            pDdiTable->pfnGetSubVerticesExp                        = loader::zeFabricVertexGetSubVerticesExp;
            pDdiTable->pfnGetPropertiesExp                         = loader::zeFabricVertexGetPropertiesExp;
            pDdiTable->pfnGetDeviceExp                             = loader::zeFabricVertexGetDeviceExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.FabricVertexExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_fabric_vertex_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_fabric_vertex_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.FabricVertexExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}